

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O3

ssize_t __thiscall
FIX::HttpConnection::read(HttpConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t size;
  SocketRecvFailed *pSVar2;
  ssize_t sVar3;
  pollfd pfd;
  pollfd local_30;
  
  local_30.fd = this->m_socket;
  local_30.events = 3;
  local_30.revents = 0;
  iVar1 = poll(&local_30,1,2000);
  if (iVar1 < 1) {
    if (iVar1 != 0) {
      pSVar2 = (SocketRecvFailed *)__cxa_allocate_exception(0x50);
      SocketRecvFailed::SocketRecvFailed(pSVar2,(long)iVar1);
      __cxa_throw(pSVar2,&SocketRecvFailed::typeinfo,FIX::Exception::~Exception);
    }
    disconnect(this,0x198);
    sVar3 = 0;
  }
  else {
    size = socket_recv(this->m_socket,this->m_buffer,0x2000);
    if (size < 1) {
      pSVar2 = (SocketRecvFailed *)__cxa_allocate_exception(0x50);
      SocketRecvFailed::SocketRecvFailed(pSVar2,size);
      __cxa_throw(pSVar2,&SocketRecvFailed::typeinfo,FIX::Exception::~Exception);
    }
    std::__cxx11::string::append((char *)&this->m_parser,(ulong)this->m_buffer);
    sVar3 = CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
    processStream(this);
  }
  return sVar3;
}

Assistant:

bool HttpConnection::read() {
#if _MSC_VER
  struct timeval timeout = {2, 0};
  fd_set readset = m_fds;
#else
  int timeout = 2000; // 2000ms = 2 seconds
  struct pollfd pfd = {m_socket, POLLIN | POLLPRI, 0};
#endif

  try {
#if _MSC_VER
    // Wait for input (1 second timeout)
    int result = select(0, &readset, 0, 0, &timeout);
#else
    // Wait for input (2 second timeout)
    int result = poll(&pfd, 1, timeout);
#endif

    if (result > 0) // Something to read
    {
      // We can read without blocking
      ssize_t size = socket_recv(m_socket, m_buffer, sizeof(m_buffer));
      if (size <= 0) {
        throw SocketRecvFailed(size);
      }
      m_parser.addToStream(m_buffer, size);
    } else if (result == 0) // Timeout
    {
      disconnect(408);
      return false;
    } else if (result < 0) // Error
    {
      throw SocketRecvFailed(result);
    }

    processStream();
    return true;
  } catch (SocketRecvFailed &) {
    disconnect();
    return false;
  }
}